

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraSim.c
# Opt level: O0

void Fra_SmlNodeTransferNext(Fra_Sml_t *p,Aig_Obj_t *pOut,Aig_Obj_t *pIn,int iFrame)

{
  int iVar1;
  int iVar2;
  uint *puVar3;
  uint *puVar4;
  int local_3c;
  int i;
  uint *pSims1;
  uint *pSims0;
  int iFrame_local;
  Aig_Obj_t *pIn_local;
  Aig_Obj_t *pOut_local;
  Fra_Sml_t *p_local;
  
  iVar2 = Aig_IsComplement(pOut);
  if (iVar2 != 0) {
    __assert_fail("!Aig_IsComplement(pOut)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraSim.c"
                  ,0x269,"void Fra_SmlNodeTransferNext(Fra_Sml_t *, Aig_Obj_t *, Aig_Obj_t *, int)")
    ;
  }
  iVar2 = Aig_IsComplement(pIn);
  if (iVar2 != 0) {
    __assert_fail("!Aig_IsComplement(pIn)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraSim.c"
                  ,0x26a,"void Fra_SmlNodeTransferNext(Fra_Sml_t *, Aig_Obj_t *, Aig_Obj_t *, int)")
    ;
  }
  iVar2 = Aig_ObjIsCo(pOut);
  if (iVar2 == 0) {
    __assert_fail("Aig_ObjIsCo(pOut)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraSim.c"
                  ,0x26b,"void Fra_SmlNodeTransferNext(Fra_Sml_t *, Aig_Obj_t *, Aig_Obj_t *, int)")
    ;
  }
  iVar2 = Aig_ObjIsCi(pIn);
  if (iVar2 != 0) {
    if ((iFrame != 0) && (p->nWordsTotal <= p->nWordsFrame)) {
      __assert_fail("iFrame == 0 || p->nWordsFrame < p->nWordsTotal",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraSim.c"
                    ,0x26d,
                    "void Fra_SmlNodeTransferNext(Fra_Sml_t *, Aig_Obj_t *, Aig_Obj_t *, int)");
    }
    puVar3 = Fra_ObjSim(p,pOut->Id);
    iVar2 = p->nWordsFrame;
    puVar4 = Fra_ObjSim(p,pIn->Id);
    iVar1 = p->nWordsFrame;
    for (local_3c = 0; local_3c < p->nWordsFrame; local_3c = local_3c + 1) {
      puVar4[(long)(iVar1 * (iFrame + 1)) + (long)local_3c] =
           puVar3[(long)(iVar2 * iFrame) + (long)local_3c];
    }
    return;
  }
  __assert_fail("Aig_ObjIsCi(pIn)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraSim.c"
                ,0x26c,"void Fra_SmlNodeTransferNext(Fra_Sml_t *, Aig_Obj_t *, Aig_Obj_t *, int)");
}

Assistant:

void Fra_SmlNodeTransferNext( Fra_Sml_t * p, Aig_Obj_t * pOut, Aig_Obj_t * pIn, int iFrame )
{
    unsigned * pSims0, * pSims1;
    int i;
    assert( !Aig_IsComplement(pOut) );
    assert( !Aig_IsComplement(pIn) );
    assert( Aig_ObjIsCo(pOut) );
    assert( Aig_ObjIsCi(pIn) );
    assert( iFrame == 0 || p->nWordsFrame < p->nWordsTotal );
    // get hold of the simulation information
    pSims0 = Fra_ObjSim(p, pOut->Id) + p->nWordsFrame * iFrame;
    pSims1 = Fra_ObjSim(p, pIn->Id) + p->nWordsFrame * (iFrame+1);
    // copy information as it is
    for ( i = 0; i < p->nWordsFrame; i++ )
        pSims1[i] = pSims0[i];
}